

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O1

dgMatrix * __thiscall
dgMeshEffect::CalculateOOBB(dgMatrix *__return_storage_ptr__,dgMeshEffect *this,dgBigVector *size)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  dgMatrix *pdVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_register_00001404 [12];
  dgMatrix permuation;
  dgSphere sphere;
  dgMatrix local_108;
  dgSphere local_c8;
  dgMatrix local_70;
  
  dgPolyhedra::CalculateSphere
            (&local_c8,&this->super_dgPolyhedra,(HaF64 *)this->m_points,0x20,(dgMatrix *)0x0);
  if (((((long)ABS((double)local_c8.m_size.super_dgTemplateVector<float>.m_x) < 0x7ff0000000000000)
       && (!NAN(local_c8.m_size.super_dgTemplateVector<float>.m_x))) &&
      ((long)ABS((double)local_c8.m_size.super_dgTemplateVector<float>.m_y) < 0x7ff0000000000000))
     && (((!NAN(local_c8.m_size.super_dgTemplateVector<float>.m_y) &&
          ((long)ABS((double)local_c8.m_size.super_dgTemplateVector<float>.m_z) < 0x7ff0000000000000
          )) && ((!NAN(local_c8.m_size.super_dgTemplateVector<float>.m_z) &&
                 (((long)ABS((double)local_c8.m_size.super_dgTemplateVector<float>.m_w) <
                   0x7ff0000000000000 && (!NAN(local_c8.m_size.super_dgTemplateVector<float>.m_w))))
                 ))))) {
    (size->super_dgTemplateVector<double>).m_x =
         (double)local_c8.m_size.super_dgTemplateVector<float>.m_x;
    (size->super_dgTemplateVector<double>).m_y =
         (double)local_c8.m_size.super_dgTemplateVector<float>.m_y;
    (size->super_dgTemplateVector<double>).m_z =
         (double)local_c8.m_size.super_dgTemplateVector<float>.m_z;
    (size->super_dgTemplateVector<double>).m_w =
         (double)local_c8.m_size.super_dgTemplateVector<float>.m_w;
    pdVar15 = dgGetIdentityMatrix();
    local_108.m_front.super_dgTemplateVector<float>.m_z =
         (pdVar15->m_front).super_dgTemplateVector<float>.m_z;
    local_108.m_front.super_dgTemplateVector<float>.m_w =
         (pdVar15->m_front).super_dgTemplateVector<float>.m_w;
    uVar3 = (pdVar15->m_up).super_dgTemplateVector<float>.m_x;
    uVar4 = (pdVar15->m_up).super_dgTemplateVector<float>.m_w;
    uVar5 = (pdVar15->m_right).super_dgTemplateVector<float>.m_y;
    uVar6._0_4_ = (pdVar15->m_right).super_dgTemplateVector<float>.m_z;
    uVar6._4_4_ = (pdVar15->m_right).super_dgTemplateVector<float>.m_w;
    local_108.m_posit.super_dgTemplateVector<float>.m_x =
         (pdVar15->m_posit).super_dgTemplateVector<float>.m_x;
    local_108.m_posit.super_dgTemplateVector<float>.m_y =
         (pdVar15->m_posit).super_dgTemplateVector<float>.m_y;
    local_108.m_posit.super_dgTemplateVector<float>.m_z =
         (pdVar15->m_posit).super_dgTemplateVector<float>.m_z;
    local_108.m_posit.super_dgTemplateVector<float>.m_w =
         (pdVar15->m_posit).super_dgTemplateVector<float>.m_w;
    local_108.m_front.super_dgTemplateVector<float>.m_x = 0.0;
    local_108.m_front.super_dgTemplateVector<float>.m_y = 1.0;
    local_108.m_up.super_dgTemplateVector<float>.m_y = 0.0;
    local_108.m_up.super_dgTemplateVector<float>.m_z = 1.0;
    local_108.m_right.super_dgTemplateVector<float>._8_8_ = uVar6 & 0xffffffff00000000;
    local_108.m_right.super_dgTemplateVector<float>.m_y = (float)uVar5;
    local_108.m_right.super_dgTemplateVector<float>.m_x = 1.0;
    dVar1 = (size->super_dgTemplateVector<double>).m_x;
    local_108.m_up.super_dgTemplateVector<float>.m_x = (float)uVar3;
    local_108.m_up.super_dgTemplateVector<float>.m_w = (float)uVar4;
    uVar7 = local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>._0_8_;
    uVar8 = local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>._8_8_;
    uVar9 = local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>._0_8_;
    uVar10 = local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>._8_8_;
    uVar11 = local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>._0_8_;
    uVar12 = local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>._8_8_;
    uVar13 = local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>._0_8_;
    uVar14 = local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>._8_8_;
    if ((dVar1 < (size->super_dgTemplateVector<double>).m_y) ||
       (dVar1 < (size->super_dgTemplateVector<double>).m_z)) {
      do {
        local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>._8_8_ = uVar14;
        local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>._0_8_ = uVar13;
        local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>._8_8_ = uVar12;
        local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>._0_8_ = uVar11;
        local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>._8_8_ = uVar10;
        local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>._0_8_ = uVar9;
        local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>._8_8_ = uVar8;
        local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>._0_8_ = uVar7;
        dgMatrix::operator*(&local_70,&local_108,&local_c8.super_dgMatrix);
        uVar7._0_4_ = local_70.m_front.super_dgTemplateVector<float>.m_x;
        uVar7._4_4_ = local_70.m_front.super_dgTemplateVector<float>.m_y;
        uVar8._0_4_ = local_70.m_front.super_dgTemplateVector<float>.m_z;
        uVar8._4_4_ = local_70.m_front.super_dgTemplateVector<float>.m_w;
        local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_x =
             local_70.m_front.super_dgTemplateVector<float>.m_x;
        local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_y =
             local_70.m_front.super_dgTemplateVector<float>.m_y;
        local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_z =
             local_70.m_front.super_dgTemplateVector<float>.m_z;
        local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_w =
             local_70.m_front.super_dgTemplateVector<float>.m_w;
        uVar9._0_4_ = local_70.m_up.super_dgTemplateVector<float>.m_x;
        uVar9._4_4_ = local_70.m_up.super_dgTemplateVector<float>.m_y;
        uVar10._0_4_ = local_70.m_up.super_dgTemplateVector<float>.m_z;
        uVar10._4_4_ = local_70.m_up.super_dgTemplateVector<float>.m_w;
        local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_x =
             local_70.m_up.super_dgTemplateVector<float>.m_x;
        local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_y =
             local_70.m_up.super_dgTemplateVector<float>.m_y;
        local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_z =
             local_70.m_up.super_dgTemplateVector<float>.m_z;
        local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_w =
             local_70.m_up.super_dgTemplateVector<float>.m_w;
        uVar11._0_4_ = local_70.m_right.super_dgTemplateVector<float>.m_x;
        uVar11._4_4_ = local_70.m_right.super_dgTemplateVector<float>.m_y;
        uVar12._0_4_ = local_70.m_right.super_dgTemplateVector<float>.m_z;
        uVar12._4_4_ = local_70.m_right.super_dgTemplateVector<float>.m_w;
        local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_x =
             local_70.m_right.super_dgTemplateVector<float>.m_x;
        local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_y =
             local_70.m_right.super_dgTemplateVector<float>.m_y;
        local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_z =
             local_70.m_right.super_dgTemplateVector<float>.m_z;
        local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_w =
             local_70.m_right.super_dgTemplateVector<float>.m_w;
        uVar13._0_4_ = local_70.m_posit.super_dgTemplateVector<float>.m_x;
        uVar13._4_4_ = local_70.m_posit.super_dgTemplateVector<float>.m_y;
        uVar14._0_4_ = local_70.m_posit.super_dgTemplateVector<float>.m_z;
        uVar14._4_4_ = local_70.m_posit.super_dgTemplateVector<float>.m_w;
        local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_x =
             local_70.m_posit.super_dgTemplateVector<float>.m_x;
        local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_y =
             local_70.m_posit.super_dgTemplateVector<float>.m_y;
        local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_z =
             local_70.m_posit.super_dgTemplateVector<float>.m_z;
        local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_w =
             local_70.m_posit.super_dgTemplateVector<float>.m_w;
        auVar20._0_4_ = (float)(size->super_dgTemplateVector<double>).m_x;
        auVar20._4_12_ = in_register_00001404;
        fVar19 = (float)(size->super_dgTemplateVector<double>).m_y;
        auVar21._0_4_ = (float)(size->super_dgTemplateVector<double>).m_z;
        auVar21._4_12_ = in_register_00001404;
        fVar17 = (float)(size->super_dgTemplateVector<double>).m_w;
        if (((((0x7f7fffff < (uint)ABS(auVar20._0_4_)) || (0x7f7fffff < (uint)ABS(fVar19))) ||
             (NAN(fVar19))) || ((0x7f7fffff < (uint)ABS(auVar21._0_4_) || (NAN(auVar21._0_4_))))) ||
           ((0x7f7fffff < (uint)ABS(fVar17) || (NAN(fVar17))))) {
          __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                        ,0x12d,"dgVector::dgVector(const dgBigVector &)");
        }
        auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * local_108.m_front.
                                                         super_dgTemplateVector<float>.m_y)),auVar20
                                 ,ZEXT416((uint)local_108.m_front.super_dgTemplateVector<float>.m_x)
                                );
        auVar2 = vfmadd231ss_fma(auVar2,auVar21,
                                 ZEXT416((uint)local_108.m_front.super_dgTemplateVector<float>.m_z))
        ;
        fVar16 = auVar2._0_4_;
        auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * local_108.m_up.
                                                         super_dgTemplateVector<float>.m_y)),auVar20
                                 ,ZEXT416((uint)local_108.m_up.super_dgTemplateVector<float>.m_x));
        auVar2 = vfmadd231ss_fma(auVar2,auVar21,
                                 ZEXT416((uint)local_108.m_up.super_dgTemplateVector<float>.m_z));
        fVar18 = auVar2._0_4_;
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar19 * local_108.m_right.
                                                          super_dgTemplateVector<float>.m_y)),
                                  auVar20,ZEXT416((uint)local_108.m_right.
                                                        super_dgTemplateVector<float>.m_x));
        auVar20 = vfmadd231ss_fma(auVar20,auVar21,
                                  ZEXT416((uint)local_108.m_right.super_dgTemplateVector<float>.m_z)
                                 );
        fVar19 = auVar20._0_4_;
        if (((NAN(fVar19)) || (NAN(fVar18))) ||
           ((0x7f7fffff < (uint)ABS(fVar16) ||
            ((0x7f7fffff < (uint)ABS(fVar18) || (0x7f7fffff < (uint)ABS(fVar19))))))) {
          __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                        ,0x134,
                        "dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
        }
        if ((((NAN(fVar16)) || (0x7fefffffffffffff < (long)ABS((double)fVar16))) ||
            (0x7fefffffffffffff < (long)ABS((double)fVar18))) ||
           ((0x7fefffffffffffff < (long)ABS((double)fVar19) ||
            (0x7fefffffffffffff < (long)ABS((double)fVar17))))) goto LAB_0088688a;
        (size->super_dgTemplateVector<double>).m_x = (double)fVar16;
        (size->super_dgTemplateVector<double>).m_y = (double)fVar18;
        (size->super_dgTemplateVector<double>).m_z = (double)fVar19;
        (size->super_dgTemplateVector<double>).m_w = (double)fVar17;
      } while ((fVar16 < fVar18) ||
              (uVar7 = local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>._0_8_,
              uVar8 = local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>._8_8_,
              uVar9 = local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>._0_8_,
              uVar10 = local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>._8_8_,
              uVar11 = local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>._0_8_,
              uVar12 = local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>._8_8_,
              uVar13 = local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>._0_8_,
              uVar14 = local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>._8_8_,
              fVar16 < fVar19));
    }
    (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_x =
         local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_x;
    (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_y =
         local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_y;
    (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_z =
         local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_z;
    (__return_storage_ptr__->m_front).super_dgTemplateVector<float>.m_w =
         local_c8.super_dgMatrix.m_front.super_dgTemplateVector<float>.m_w;
    (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_x =
         local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_x;
    (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_y =
         local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_y;
    (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_z =
         local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_z;
    (__return_storage_ptr__->m_up).super_dgTemplateVector<float>.m_w =
         local_c8.super_dgMatrix.m_up.super_dgTemplateVector<float>.m_w;
    (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_x =
         local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_x;
    (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_y =
         local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_y;
    (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_z =
         local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_z;
    (__return_storage_ptr__->m_right).super_dgTemplateVector<float>.m_w =
         local_c8.super_dgMatrix.m_right.super_dgTemplateVector<float>.m_w;
    (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_x =
         local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_x;
    (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_y =
         local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_y;
    (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_z =
         local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_z;
    (__return_storage_ptr__->m_posit).super_dgTemplateVector<float>.m_w =
         local_c8.super_dgMatrix.m_posit.super_dgTemplateVector<float>.m_w;
    return __return_storage_ptr__;
  }
LAB_0088688a:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x13f,"dgBigVector::dgBigVector(const dgVector &)");
}

Assistant:

dgMatrix dgMeshEffect::CalculateOOBB (dgBigVector& size) const
{
	dgSphere sphere (CalculateSphere (&m_points[0].m_x, sizeof (dgBigVector), NULL));
	size = sphere.m_size;

	dgMatrix permuation (dgGetIdentityMatrix());
	permuation[0][0] = hacd::HaF32 (0.0f);
	permuation[0][1] = hacd::HaF32 (1.0f);
	permuation[1][1] = hacd::HaF32 (0.0f);
	permuation[1][2] = hacd::HaF32 (1.0f);
	permuation[2][2] = hacd::HaF32 (0.0f);
	permuation[2][0] = hacd::HaF32 (1.0f);

	while ((size.m_x < size.m_y) || (size.m_x < size.m_z)) {
		sphere = permuation * sphere;
		size = permuation.UnrotateVector(size);
	}

	return sphere;
}